

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O3

uint ON_GetVersionQuartet
               (uint major_version,uint minor_version,uint year,uint month,uint day_of_month,
               uint hour,uint minute,uint branch,unsigned_short *quartet_values)

{
  unsigned_short uVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = ON_VersionNumberConstruct(major_version,minor_version,year,month,day_of_month,branch);
  lVar3 = 0;
  do {
    if (0xffff < major_version) {
      uVar2 = 0;
    }
    uVar1 = (unsigned_short)major_version;
    if (0xffff < major_version) {
      uVar1 = 0;
    }
    quartet_values[lVar3] = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return uVar2;
}

Assistant:

unsigned int ON_GetVersionQuartet(
  unsigned int major_version,
  unsigned int minor_version,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int hour,
  unsigned int minute,
  unsigned int branch,
  unsigned short quartet_values[4]
  )
{
  unsigned int i;
  unsigned int item_value;
  unsigned int version_number = ON_VersionNumberConstruct(
                                      major_version,
                                      minor_version,
                                      year,
                                      month,
                                      day_of_month,
                                      branch
                                      );

  if ( hour >= 24 || minute >= 60 )
  {
    if ( 24 == hour && 0 == minute )
    {
      // leap second
      hour = 23;
      minute = 60;
    }
    if ( 23 != hour || 60 != minute )
    {
      hour = 0;
      minute = 0;
    }
  }

  for(i = 0; i < 4; i++ )
  {
    switch(i)
    {
    case 0:
      item_value = major_version;
      break;
    case 1:
      item_value = minor_version;
      break;
    case 2:
      item_value = (year-2000)*1000 + ON_DayOfGregorianYear(year,month,day_of_month);
      break;
    case 3:
      item_value = (hour*100 + minute)*10 + branch;
      break;
    default:
      continue;
      break;
    }

    if ( item_value > 0xFFFF )
    {
      version_number = 0;
      item_value = 0;
    }

    quartet_values[i] = (unsigned short)item_value;
  }

  return version_number;
}